

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timidity.cpp
# Opt level: O3

int Timidity::LoadConfig(char *filename)

{
  int iVar1;
  ToneBank *pTVar2;
  
  PathExpander::clearPathlist((PathExpander *)pathExpander);
  PathExpander::addToPathlist((PathExpander *)pathExpander,"/usr/local/lib/timidity");
  PathExpander::addToPathlist((PathExpander *)pathExpander,"/etc/timidity");
  PathExpander::addToPathlist((PathExpander *)pathExpander,"/etc");
  if (tonebank == (ToneBank *)0x0) {
    pTVar2 = (ToneBank *)operator_new(0x408);
    ToneBank::ToneBank(pTVar2);
    tonebank = pTVar2;
    pTVar2 = (ToneBank *)operator_new(0x408);
    ToneBank::ToneBank(pTVar2);
    drumset = pTVar2;
  }
  iVar1 = read_config_file(filename,true);
  return iVar1;
}

Assistant:

int LoadConfig(const char *filename)
{
	/* !!! FIXME: This may be ugly, but slightly less so than requiring the
	 *			  default search path to have only one element. I think.
	 *
	 *			  We only need to include the likely locations for the config
	 *			  file itself since that file should contain any other directory
	 *			  that needs to be added to the search path.
	 */
	pathExpander.clearPathlist();
#ifdef _WIN32
	pathExpander.addToPathlist("C:\\TIMIDITY");
	pathExpander.addToPathlist("\\TIMIDITY");
	pathExpander.addToPathlist(progdir);
#else
	pathExpander.addToPathlist("/usr/local/lib/timidity");
	pathExpander.addToPathlist("/etc/timidity");
	pathExpander.addToPathlist("/etc");
#endif

	/* Some functions get aggravated if not even the standard banks are available. */
	if (tonebank[0] == NULL)
	{
		tonebank[0] = new ToneBank;
		drumset[0] = new ToneBank;
	}

	return read_config_file(filename, true);
}